

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeTree.cpp
# Opt level: O0

ostream * Indexing::operator<<(ostream *out,CodeTree *ct)

{
  ostream *in_RDI;
  CodeTree *in_stack_00000128;
  anon_class_8_1_ba1d6aae in_stack_00000130;
  
  CodeTree::operator<<(in_stack_00000128,in_stack_00000130);
  return in_RDI;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const CodeTree& ct)
{
  ct.visitAllOps([&out](const CodeTree::CodeOp* op, unsigned depth) {
    for (unsigned i = 0; i < depth; i++) {
      out << "  ";
    }
    out << *op << std::endl;
  });
  return out;
}